

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt.cpp
# Opt level: O0

char * fmt::v6::internal::sprintf_format<long_double>
                 (longdouble value,buffer<char> *buf,sprintf_specs specs)

{
  char *pcVar1;
  int value_00;
  type tVar2;
  type __n;
  char *pcVar3;
  ulong in_RSI;
  buffer<char> *in_RDI;
  bool bVar4;
  unkbyte10 in_stack_00000008;
  char *where;
  char *end;
  char *p;
  uint n;
  int result;
  size_t buffer_size;
  char *decimal_point_pos;
  char *start;
  char type;
  char *format_ptr;
  char format [10];
  size_t new_capacity;
  undefined2 uVar5;
  undefined6 in_stack_ffffffffffffff52;
  buffer<char> *in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff68;
  undefined2 uVar6;
  undefined6 uStack_96;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  char *local_68;
  char *local_50;
  char local_39;
  char *local_38;
  char local_29 [9];
  buffer<char> *local_20;
  unkbyte10 local_18;
  undefined8 local_8;
  
  local_18 = in_stack_00000008;
  local_38 = local_29;
  local_8._4_1_ = (char)(in_RSI >> 0x20);
  if (((in_RSI & 0x10000000000) != 0) || (local_8._4_1_ == '\0')) {
    local_38 = local_29 + 1;
    local_29[0] = '#';
  }
  local_8._0_4_ = (int)in_RSI;
  if (-1 < (int)local_8) {
    pcVar3 = local_38 + 1;
    *local_38 = '.';
    local_38 = local_38 + 2;
    *pcVar3 = '*';
  }
  *local_38 = 'L';
  local_39 = local_8._4_1_;
  if (local_8._4_1_ == '%') {
    local_39 = 'f';
  }
  else if ((local_8._4_1_ == '\0') || (local_8._4_1_ == 'n')) {
    local_39 = 'g';
  }
  local_38[1] = local_39;
  local_38[2] = '\0';
  local_50 = (char *)0x0;
  local_20 = in_RDI;
  local_8 = in_RSI;
  while( true ) {
    while( true ) {
      buffer<char>::capacity(local_20);
      buffer<char>::operator[]<int>(local_20,0);
      new_capacity = (size_t)local_18;
      uVar5 = (undefined2)((unkuint10)local_18 >> 0x40);
      value_00 = format_float<long_double>
                           (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                            in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                            (longdouble)
                            CONCAT28(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60));
      if (-1 < value_00) break;
      in_stack_ffffffffffffff60 = local_20;
      buffer<char>::capacity(local_20);
      buffer<char>::reserve((buffer<char> *)CONCAT62(in_stack_ffffffffffffff52,uVar5),new_capacity);
    }
    tVar2 = to_unsigned<int>(value_00);
    in_stack_ffffffffffffff80 = (char *)(ulong)tVar2;
    pcVar3 = (char *)buffer<char>::capacity(local_20);
    if (in_stack_ffffffffffffff80 < pcVar3) break;
    buffer<char>::reserve((buffer<char> *)CONCAT62(in_stack_ffffffffffffff52,uVar5),new_capacity);
  }
  local_68 = buffer<char>::data(local_20);
  pcVar3 = local_68 + tVar2;
  if ((*local_68 == '+') || (*local_68 == '-')) {
    local_68 = local_68 + 1;
  }
  if ((local_8._4_1_ != 'a') && (local_8._4_1_ != 'A')) {
    while( true ) {
      bVar4 = false;
      if ((local_68 < pcVar3) && (bVar4 = false, '/' < *local_68)) {
        bVar4 = *local_68 < ':';
      }
      if (!bVar4) break;
      local_68 = local_68 + 1;
    }
    if ((((local_68 < pcVar3) && (*local_68 != 'e')) && (*local_68 != 'E')) &&
       (local_50 = local_68, local_8._4_1_ == '\0')) {
      pcVar1 = local_68 + 1;
      if (local_68[1] == '0') {
        pcVar1 = local_68 + 2;
      }
      while( true ) {
        local_68 = pcVar1;
        pcVar1 = local_68;
        bVar4 = false;
        if ((local_68 != pcVar3) && (bVar4 = false, '0' < *local_68)) {
          bVar4 = *local_68 < ':';
        }
        if (!bVar4) break;
        pcVar1 = local_68 + 1;
      }
      while( true ) {
        bVar4 = false;
        if (local_68 != pcVar3) {
          bVar4 = *local_68 == '0';
        }
        if (!bVar4) break;
        local_68 = local_68 + 1;
      }
      if ((((local_68 == pcVar3) || (*local_68 < '0')) || ('9' < *local_68)) && (local_68 != pcVar3)
         ) {
        uVar6 = SUB82(pcVar1,0);
        uStack_96 = (undefined6)((ulong)pcVar1 >> 0x10);
        __n = to_unsigned<long>((long)pcVar3 - (long)local_68);
        memmove((void *)CONCAT62(uStack_96,uVar6),local_68,__n);
      }
    }
  }
  buffer<char>::resize((buffer<char> *)CONCAT62(in_stack_ffffffffffffff52,uVar5),new_capacity);
  return local_50;
}

Assistant:

char *sprintf_format(Double value, internal::buffer<char> &buf, sprintf_specs specs)
{
    // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
    FMT_ASSERT(buf.capacity() != 0, "empty buffer");

    // Build format string.
    enum
    {
        max_format_size = 10
    }; // longest format: %#-*.*Lg
    char format[max_format_size];
    char *format_ptr = format;
    *format_ptr++ = '%';
    if (specs.alt || !specs.type)
        *format_ptr++ = '#';
    if (specs.precision >= 0)
    {
        *format_ptr++ = '.';
        *format_ptr++ = '*';
    }
    if (std::is_same<Double, long double>::value)
        *format_ptr++ = 'L';

    char type = specs.type;

    if (type == '%')
        type = 'f';
    else if (type == 0 || type == 'n')
        type = 'g';
#if FMT_MSC_VER
    if (type == 'F')
    {
        // MSVC's printf doesn't support 'F'.
        type = 'f';
    }
#endif
    *format_ptr++ = type;
    *format_ptr = '\0';

    // Format using snprintf.
    char *start = nullptr;
    char *decimal_point_pos = nullptr;
    for (;;)
    {
        std::size_t buffer_size = buf.capacity();
        start = &buf[0];
        int result = format_float(start, buffer_size, format, specs.precision, value);
        if (result >= 0)
        {
            unsigned n = internal::to_unsigned(result);
            if (n < buf.capacity())
            {
                // Find the decimal point.
                auto p = buf.data(), end = p + n;
                if (*p == '+' || *p == '-')
                    ++p;
                if (specs.type != 'a' && specs.type != 'A')
                {
                    while (p < end && *p >= '0' && *p <= '9')
                        ++p;
                    if (p < end && *p != 'e' && *p != 'E')
                    {
                        decimal_point_pos = p;
                        if (!specs.type)
                        {
                            // Keep only one trailing zero after the decimal point.
                            ++p;
                            if (*p == '0')
                                ++p;
                            while (p != end && *p >= '1' && *p <= '9')
                                ++p;
                            char *where = p;
                            while (p != end && *p == '0')
                                ++p;
                            if (p == end || *p < '0' || *p > '9')
                            {
                                if (p != end)
                                    std::memmove(where, p, to_unsigned(end - p));
                                n -= static_cast<unsigned>(p - where);
                            }
                        }
                    }
                }
                buf.resize(n);
                break; // The buffer is large enough - continue with formatting.
            }
            buf.reserve(n + 1);
        }
        else
        {
            // If result is negative we ask to increase the capacity by at least 1,
            // but as std::vector, the buffer grows exponentially.
            buf.reserve(buf.capacity() + 1);
        }
    }
    return decimal_point_pos;
}